

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_entry.c
# Opt level: O0

wchar_t archive_entry_update_gname_utf8(archive_entry *entry,char *name)

{
  wchar_t wVar1;
  int *piVar2;
  char *in_stack_00000028;
  archive_mstring *in_stack_00000030;
  archive *in_stack_00000038;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  wVar1 = archive_mstring_update_utf8(in_stack_00000038,in_stack_00000030,in_stack_00000028);
  if (wVar1 == L'\0') {
    wVar1 = L'\x01';
  }
  else {
    piVar2 = __errno_location();
    if (*piVar2 == 0xc) {
      __archive_errx(name._4_4_,
                     (char *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8));
    }
    wVar1 = L'\0';
  }
  return wVar1;
}

Assistant:

int
archive_entry_update_gname_utf8(struct archive_entry *entry, const char *name)
{
	if (archive_mstring_update_utf8(entry->archive,
	    &entry->ae_gname, name) == 0)
		return (1);
	if (errno == ENOMEM)
		__archive_errx(1, "No memory");
	return (0);
}